

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# o3dgcTriangleFans.cpp
# Opt level: O1

O3DGCErrorCode o3dgc::SaveUIntData(Vector<long> *data,BinaryStream *bstream)

{
  unsigned_long uVar1;
  unsigned_long uVar2;
  long lVar3;
  uchar local_3a;
  byte local_39;
  unsigned_long local_38;
  
  local_38 = (bstream->m_stream).m_size;
  lVar3 = 5;
  do {
    local_3a = '\0';
    Vector<unsigned_char>::PushBack(&bstream->m_stream,&local_3a);
    lVar3 = lVar3 + -1;
  } while (lVar3 != 0);
  uVar1 = data->m_size;
  lVar3 = 5;
  uVar2 = uVar1;
  do {
    local_39 = (byte)uVar2 & 0x7f;
    Vector<unsigned_char>::PushBack(&bstream->m_stream,&local_39);
    uVar2 = uVar2 >> 7;
    lVar3 = lVar3 + -1;
  } while (lVar3 != 0);
  if (uVar1 != 0) {
    uVar2 = 0;
    do {
      BinaryStream::WriteUIntASCII(bstream,data->m_buffer[uVar2]);
      uVar2 = uVar2 + 1;
    } while (uVar1 != uVar2);
  }
  BinaryStream::WriteUInt32ASCII(bstream,local_38,(bstream->m_stream).m_size - local_38);
  return O3DGC_OK;
}

Assistant:

O3DGCErrorCode    SaveUIntData(const Vector<long> & data,
                                   BinaryStream & bstream) 
    {
        unsigned long start = bstream.GetSize();
        bstream.WriteUInt32ASCII(0);
        const unsigned long size       = data.GetSize();
        bstream.WriteUInt32ASCII(size);
        for(unsigned long i = 0; i < size; ++i)
        {
            bstream.WriteUIntASCII(data[i]);
        }
        bstream.WriteUInt32ASCII(start, bstream.GetSize() - start);
        return O3DGC_OK;
    }